

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int DLevelScript::ThingCount(int type,int stringid,int tid,int tag)

{
  byte bVar1;
  PClass *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *name;
  undefined8 *puVar6;
  undefined8 uVar7;
  PClass *pPVar8;
  DThinker *pDVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClassActor *pPVar10;
  undefined8 *puVar11;
  PClassActor *unaff_R15;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_48;
  
  if (type < 1) {
    if (stringid < 0) {
      unaff_R15 = (PClassActor *)0x0;
    }
    else {
      name = FBehavior::StaticLookupString(stringid);
      if (name == (char *)0x0) {
        bVar3 = false;
      }
      else {
        unaff_R15 = PClass::FindActor(name);
        bVar3 = unaff_R15 != (PClassActor *)0x0;
      }
      if (!bVar3) {
        return 0;
      }
    }
  }
  else {
    unaff_R15 = P_GetSpawnableType(type);
    if (unaff_R15 == (PClassActor *)0x0) {
      return 0;
    }
  }
  bVar1 = 1;
  iVar4 = 0;
  do {
    if (tid != 0) {
      puVar11 = (undefined8 *)0x0;
LAB_003bb4af:
      do {
        puVar6 = puVar11 + 0x57;
        if (puVar11 == (undefined8 *)0x0) {
          puVar6 = (undefined8 *)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
        }
        for (puVar11 = (undefined8 *)*puVar6;
            (puVar11 != (undefined8 *)0x0 && (*(int *)(puVar11 + 0x52) != tid));
            puVar11 = (undefined8 *)puVar11[0x57]) {
        }
        if (puVar11 == (undefined8 *)0x0) goto LAB_003bb6bb;
        if (0 < *(int *)((long)puVar11 + 0x1fc)) {
          if (unaff_R15 != (PClassActor *)0x0) {
            if (puVar11[1] == 0) {
              uVar7 = (**(code **)*puVar11)(puVar11);
              puVar11[1] = uVar7;
            }
            if ((PClassActor *)puVar11[1] != unaff_R15) goto LAB_003bb4af;
          }
          if ((tag == -1) ||
             (bVar3 = FTagManager::SectorHasTag(&tagManager,(sector_t *)puVar11[0x26],tag), bVar3))
          {
            pPVar2 = AInventory::RegistrationInfo.MyClass;
            if (puVar11[1] == 0) {
              uVar7 = (**(code **)*puVar11)(puVar11);
              puVar11[1] = uVar7;
            }
            pPVar8 = (PClass *)puVar11[1];
            bVar3 = pPVar8 != (PClass *)0x0;
            if (pPVar8 != pPVar2 && bVar3) {
              do {
                pPVar8 = pPVar8->ParentClass;
                bVar3 = pPVar8 != (PClass *)0x0;
                if (pPVar8 == pPVar2) break;
              } while (pPVar8 != (PClass *)0x0);
            }
            if ((bVar3) && (puVar11[0x98] != 0)) {
              if ((*(byte *)(puVar11[0x98] + 0x20) & 0x20) == 0) goto LAB_003bb4af;
              puVar11[0x98] = 0;
            }
            iVar4 = iVar4 + 1;
          }
        }
      } while( true );
    }
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    pDVar9 = FThinkerIterator::Next(&local_48,false);
    while (pDVar9 != (DThinker *)0x0) {
      if (0 < *(int *)((long)&pDVar9[9].super_DObject._vptr_DObject + 4)) {
        if (unaff_R15 != (PClassActor *)0x0) {
          if ((pDVar9->super_DObject).Class == (PClass *)0x0) {
            iVar5 = (**(pDVar9->super_DObject)._vptr_DObject)(pDVar9);
            (pDVar9->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar5);
          }
          if ((PClassActor *)(pDVar9->super_DObject).Class != unaff_R15) goto LAB_003bb6a3;
        }
        if ((tag == -1) ||
           (bVar3 = FTagManager::SectorHasTag
                              (&tagManager,(sector_t *)pDVar9[5].super_DObject.GCNext,tag), bVar3))
        {
          pPVar2 = AInventory::RegistrationInfo.MyClass;
          if ((pDVar9->super_DObject).Class == (PClass *)0x0) {
            iVar5 = (**(pDVar9->super_DObject)._vptr_DObject)(pDVar9);
            (pDVar9->super_DObject).Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
          }
          pPVar8 = (pDVar9->super_DObject).Class;
          bVar3 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar2 && bVar3) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar3 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar2) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if ((bVar3) && (pDVar9[0x15].NextThinker != (DThinker *)0x0)) {
            if ((((pDVar9[0x15].NextThinker)->super_DObject).ObjectFlags & 0x20) == 0)
            goto LAB_003bb6a3;
            pDVar9[0x15].NextThinker = (DThinker *)0x0;
          }
          iVar4 = iVar4 + 1;
        }
      }
LAB_003bb6a3:
      pDVar9 = FThinkerIterator::Next(&local_48,false);
    }
LAB_003bb6bb:
    if ((bool)(~bVar1 & 1) || unaff_R15 == (PClassActor *)0x0) {
      return iVar4;
    }
    pPVar10 = PClassActor::GetReplacement(unaff_R15,true);
    bVar1 = 0;
    bVar3 = pPVar10 == unaff_R15;
    unaff_R15 = pPVar10;
    if (bVar3) {
      return iVar4;
    }
  } while( true );
}

Assistant:

int DLevelScript::ThingCount (int type, int stringid, int tid, int tag)
{
	AActor *actor;
	PClassActor *kind;
	int count = 0;
	bool replacemented = false;

	if (type > 0)
	{
		kind = P_GetSpawnableType(type);
		if (kind == NULL)
			return 0;
	}
	else if (stringid >= 0)
	{
		const char *type_name = FBehavior::StaticLookupString (stringid);
		if (type_name == NULL)
			return 0;

		kind = PClass::FindActor(type_name);
		if (kind == NULL)
			return 0;
	}
	else
	{
		kind = NULL;
	}

do_count:
	if (tid)
	{
		FActorIterator iterator (tid);
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	else
	{
		TThinkerIterator<AActor> iterator;
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	if (!replacemented && kind != NULL)
	{
		// Again, with decorate replacements
		replacemented = true;
		PClassActor *newkind = kind->GetReplacement();
		if (newkind != kind)
		{
			kind = newkind;
			goto do_count;
		}
	}
	return count;
}